

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O0

bool ON_XMLNodePrivate::AssertValidTag(ON_wString *tag)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ON_wString local_30;
  ON_wString sEsc;
  int semicolon;
  int find;
  int pos;
  int quoteCount;
  ON_wString *tag_local;
  
  iVar2 = ON_wString::Count(tag,L'\"');
  if (iVar2 % 2 == 0) {
    iVar2 = ON_wString::Count(tag,L'<');
    iVar3 = ON_wString::Count(tag,L'>');
    if (iVar2 == iVar3) {
      semicolon = 0;
      sEsc.m_s._4_4_ = -1;
      do {
        iVar2 = ON_wString::Find(tag,L'&',semicolon);
        sEsc.m_s._4_4_ = iVar2;
        if (-1 < iVar2) {
          semicolon = iVar2 + 1;
          sEsc.m_s._0_4_ = ON_wString::Find(tag,L';',iVar2);
          if ((int)sEsc.m_s < 0) {
            tag_local._7_1_ = 0;
            goto LAB_009b0867;
          }
          ON_wString::Mid(&local_30,(int)tag,iVar2);
          bVar1 = ON_wString::IsXMLSpecialCharacterEncoding(&local_30);
          if (!bVar1) {
            tag_local._7_1_ = 0;
          }
          ON_wString::~ON_wString(&local_30);
          if (!bVar1) goto LAB_009b0867;
        }
      } while (-1 < sEsc.m_s._4_4_);
      tag_local._7_1_ = 1;
    }
    else {
      tag_local._7_1_ = 0;
    }
  }
  else {
    tag_local._7_1_ = 0;
  }
LAB_009b0867:
  return (bool)(tag_local._7_1_ & 1);
}

Assistant:

bool ON_XMLNodePrivate::AssertValidTag(const ON_wString& tag) // Static.
{
  // Check for an even number of quotes - odd means there are quotes in the strings.
  const int quoteCount = tag.Count(L'\"');

  if ((quoteCount % 2) != 0)
  {
    // Odd number of quotes; fail.
    OUTPUT_DEBUG_STRING_EOL(L"Odd number of quotes");
    return false;
  }

  if (tag.Count(L'<') != tag.Count(L'>'))
  {
    OUTPUT_DEBUG_STRING_EOL(L"Bad tag format; even on nested tags, < and > should be equal");
    return false;
  }

  // Check for lone ampersands.
  int pos = 0;
  int find = -1;
  do
  {
    find = tag.Find(L'&', pos);
    if (find >= 0)
    {
      pos = find + 1;
      const int semicolon = tag.Find(L';', find);
      if (semicolon < 0)
      {
        OUTPUT_DEBUG_STRING_EOL(L"Unterminated entity reference");
        return false;
      }

      const auto sEsc = tag.Mid(pos - 1, semicolon - pos + 2);
      if (!sEsc.IsXMLSpecialCharacterEncoding())
      {
        OUTPUT_DEBUG_STRING_EOL(L"Malformed tag on read");
        return false;
      }
    }
  }
  while (find >= 0);

  return true;
}